

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3HashClear(Hash *pH)

{
  HashElem *p;
  HashElem *pHVar1;
  
  p = pH->first;
  pH->first = (HashElem *)0x0;
  sqlite3_free(pH->ht);
  pH->ht = (_ht *)0x0;
  pH->htsize = 0;
  while (p != (HashElem *)0x0) {
    pHVar1 = p->next;
    sqlite3_free(p);
    p = pHVar1;
  }
  pH->count = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3HashClear(Hash *pH){
  HashElem *elem;         /* For looping over all elements of the table */

  assert( pH!=0 );
  elem = pH->first;
  pH->first = 0;
  sqlite3_free(pH->ht);
  pH->ht = 0;
  pH->htsize = 0;
  while( elem ){
    HashElem *next_elem = elem->next;
    sqlite3_free(elem);
    elem = next_elem;
  }
  pH->count = 0;
}